

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group_collection.cpp
# Opt level: O0

bool __thiscall duckdb::RowGroupCollection::IsEmpty(RowGroupCollection *this)

{
  bool bVar1;
  SegmentTree<duckdb::RowGroup,_true> *in_RDI;
  SegmentLock l;
  shared_ptr<duckdb::RowGroupSegmentTree,_true> *in_stack_ffffffffffffffd0;
  RowGroupCollection *this_00;
  
  shared_ptr<duckdb::RowGroupSegmentTree,_true>::operator->(in_stack_ffffffffffffffd0);
  this_00 = (RowGroupCollection *)&stack0xffffffffffffffe8;
  SegmentTree<duckdb::RowGroup,_true>::Lock(in_RDI);
  bVar1 = IsEmpty(this_00,(SegmentLock *)in_RDI);
  SegmentLock::~SegmentLock((SegmentLock *)0xbaf21b);
  return bVar1;
}

Assistant:

bool RowGroupCollection::IsEmpty() const {
	auto l = row_groups->Lock();
	return IsEmpty(l);
}